

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service.cxx
# Opt level: O2

void __thiscall
nuraft::asio_rpc_client::connected
          (asio_rpc_client *this,ptr<req_msg> *req,rpc_handler *when_done,uint64_t send_timeout_ms,
          error_code err,iterator itor)

{
  int args;
  char *args_1;
  char *args_2;
  element_type *peVar1;
  int iVar2;
  ptr<resp_msg> rsp;
  ptr<rpc_exception> except;
  uint64_t send_timeout_ms_local;
  code *local_c8;
  undefined8 local_c0;
  undefined1 local_a8 [8];
  undefined1 local_a0 [104];
  char *local_38;
  
  iVar2 = err._M_value;
  send_timeout_ms_local = send_timeout_ms;
  if (iVar2 == 0) {
    peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar1 != (element_type *)0x0) {
      iVar2 = (*peVar1->_vptr_logger[7])();
      if (3 < iVar2) {
        peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_
                  ((string *)local_a0,"%p connected to %s:%s (as a client)",this,
                   (this->host_)._M_dataplus._M_p,(this->port_)._M_dataplus._M_p);
        (*peVar1->_vptr_logger[8])
                  (peVar1,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/asio_service.cxx"
                   ,"connected",0x528,(string *)local_a0);
        std::__cxx11::string::~string((string *)local_a0);
      }
    }
    if (this->ssl_enabled_ == true) {
      local_c8 = handle_handshake;
      local_c0 = 0;
      rsp.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)this;
      std::
      _Bind<void(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client*,std::shared_ptr<nuraft::req_msg>,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>,unsigned_long,std::_Placeholder<1>))(std::shared_ptr<nuraft::req_msg>&,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>&,unsigned_long,std::error_code_const&)>
      ::
      _Bind<nuraft::asio_rpc_client*,std::shared_ptr<nuraft::req_msg>&,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>&,unsigned_long&,std::_Placeholder<1>const&>
                ((_Bind<void(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client*,std::shared_ptr<nuraft::req_msg>,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>,unsigned_long,std::_Placeholder<1>))(std::shared_ptr<nuraft::req_msg>&,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>&,unsigned_long,std::error_code_const&)>
                  *)local_a0,(offset_in_asio_rpc_client_to_subr *)&local_c8,(asio_rpc_client **)&rsp
                 ,req,when_done,&send_timeout_ms_local,(_Placeholder<1> *)&std::placeholders::_1);
      asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>&>::
      async_handshake<std::_Bind<void(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client*,std::shared_ptr<nuraft::req_msg>,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>,unsigned_long,std::_Placeholder<1>))(std::shared_ptr<nuraft::req_msg>&,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>&,unsigned_long,std::error_code_const&)>>
                ((stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>&> *)
                 &this->ssl_socket_,client,
                 (_Bind<void_(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client_*,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_unsigned_long,_std::_Placeholder<1>))(std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_unsigned_long,_const_std::error_code_&)>
                  *)local_a0);
      std::
      _Tuple_impl<1UL,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_unsigned_long,_std::_Placeholder<1>_>
      ::~_Tuple_impl((_Tuple_impl<1UL,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_unsigned_long,_std::_Placeholder<1>_>
                      *)(local_a0 + 0x10));
    }
    else {
      (*(this->super_rpc_client)._vptr_rpc_client[2])(this,req,when_done,send_timeout_ms);
    }
  }
  else {
    LOCK();
    (this->abandoned_)._M_base._M_i = true;
    UNLOCK();
    rsp.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    rsp.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_38 = "failed to connect to peer %d, %s:%s, error %d, %s";
    args = (((req->super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
           super_msg_base).dst_;
    args_1 = (this->host_)._M_dataplus._M_p;
    args_2 = (this->port_)._M_dataplus._M_p;
    (**(code **)(*(long *)err._M_cat + 0x20))(&local_c8,err._M_cat,iVar2);
    local_a8 = (undefined1  [8])
               strfmt<100>::fmt<int,char_const*,char_const*,int,char_const*>
                         ((strfmt<100> *)local_a0,args,args_1,args_2,iVar2,(char *)local_c8);
    std::make_shared<nuraft::rpc_exception,char_const*,std::shared_ptr<nuraft::req_msg>&>
              ((char **)&except,(shared_ptr<nuraft::req_msg> *)local_a8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::
    function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>::
    operator()(when_done,&rsp,&except);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&except.super___shared_ptr<nuraft::rpc_exception,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&rsp.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  return;
}

Assistant:

void connected(ptr<req_msg>& req,
                   rpc_handler& when_done,
                   uint64_t send_timeout_ms,
                   std::error_code err,
                   asio::ip::tcp::resolver::iterator itor)
    {
        if (!err) {
            p_in( "%p connected to %s:%s (as a client)",
                  this, host_.c_str(), port_.c_str() );
            if (ssl_enabled_) {
#ifdef SSL_LIBRARY_NOT_FOUND
                assert(0); // Should not reach here.
#else
                ssl_socket_.async_handshake
                    ( asio::ssl::stream_base::client,
                      std::bind( &asio_rpc_client::handle_handshake,
                                 this,
                                 req,
                                 when_done,
                                 send_timeout_ms,
                                 std::placeholders::_1 ) );
#endif
            } else {
                this->send(req, when_done, send_timeout_ms);
            }

        } else {
            abandoned_ = true;
            ptr<resp_msg> rsp;
            ptr<rpc_exception> except
                ( cs_new<rpc_exception>
                  ( sstrfmt("failed to connect to peer %d, %s:%s, error %d, %s")
                           .fmt( req->get_dst(), host_.c_str(),
                                 port_.c_str(), err.value(), err.message().c_str() ),
                    req ) );
            when_done(rsp, except);
        }
    }